

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

void __thiscall kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::abortRead(BlockedPumpFrom *this)

{
  PromiseArena *pPVar1;
  PromiseArenaMember *node;
  AsyncPipe *this_00;
  OwnPromiseNode OVar2;
  void *pvVar3;
  TransformPromiseNodeBase *this_01;
  TransformPromiseNodeBase *this_02;
  StringPtr cancelReason;
  OwnPromiseNode local_588;
  OwnPromiseNode local_580 [6];
  OwnPromiseNode local_550 [10];
  PromiseNode *local_500;
  SourceLocation local_4f8 [51];
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  (*this->input->_vptr_AsyncInputStream[1])
            (&local_588,this->input,
             &(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::abortRead()::{lambda()#1}::
              operator()()::junk,1,1);
  OVar2.ptr = local_588.ptr;
  pPVar1 = ((local_588.ptr)->super_PromiseArenaMember).arena;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_588.ptr - (long)pPVar1) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_01 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_588,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:854:48)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_006dfb80;
    *(BlockedPumpFrom **)((long)pvVar3 + 0x3f8) = this;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    ((local_588.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_01 = (TransformPromiseNodeBase *)&local_588.ptr[-3].super_PromiseArenaMember.arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,&local_588,
               kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:854:48)>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    OVar2.ptr[-3].super_PromiseArenaMember.arena = (PromiseArena *)&PTR_destroy_006dfb80;
    OVar2.ptr[-1].super_PromiseArenaMember.arena = (PromiseArena *)this;
    OVar2.ptr[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  pPVar1 = (this_01->super_PromiseNode).super_PromiseArenaMember.arena;
  local_580[0].ptr = &this_01->super_PromiseNode;
  if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)this_01 - (long)pPVar1) < 0x30) {
    pvVar3 = operator_new(0x400);
    this_02 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_02,local_580,kj::_::IdentityFunc<void>::operator());
    *(undefined ***)((long)pvVar3 + 0x3d0) = &PTR_destroy_006dfbd8;
    *(BlockedPumpFrom **)((long)pvVar3 + 0x3f8) = this;
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    (this_01->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
    this_02 = (TransformPromiseNodeBase *)&this_01[-2].dependency;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_02,local_580,kj::_::IdentityFunc<void>::operator());
    this_01[-2].dependency.ptr = (PromiseNode *)&PTR_destroy_006dfbd8;
    this_01[-1].continuationTracePtr = this;
    this_01[-2].continuationTracePtr = pPVar1;
  }
  local_4f8[0].fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
  ;
  local_4f8[0].function = "operator()";
  local_4f8[0].lineNumber = 0x356;
  local_4f8[0].columnNumber = 0x10;
  local_550[0].ptr = &this_02->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_500,local_550,local_4f8);
  OVar2.ptr = local_550[0].ptr;
  if ((TransformPromiseNodeBase *)local_550[0].ptr != (TransformPromiseNodeBase *)0x0) {
    local_550[0].ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_580[0].ptr;
  if ((TransformPromiseNodeBase *)local_580[0].ptr != (TransformPromiseNodeBase *)0x0) {
    local_580[0].ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  OVar2.ptr = local_588.ptr;
  if (&(local_588.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_588.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(OVar2.ptr)->super_PromiseArenaMember);
  }
  node = &((this->checkEofTask).super_PromiseBase.node.ptr)->super_PromiseArenaMember;
  (this->checkEofTask).super_PromiseBase.node.ptr = local_500;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  this_00 = this->pipe;
  if ((BlockedPumpFrom *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncCapabilityStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");

      // The input might have reached EOF, but we haven't detected it yet because we haven't tried
      // to read that far. If we had not optimized tryPumpFrom() and instead used the default
      // pumpTo() implementation, then the input would not have called write() again once it
      // reached EOF, and therefore the abortRead() on the other end would *not* propagate an
      // exception! We need the same behavior here. To that end, we need to detect if we're at EOF
      // by reading one last byte.
      checkEofTask = kj::evalNow([&]() {
        static char junk;
        return input.tryRead(&junk, 1, 1).then([this](uint64_t n) {
          if (n == 0) {
            fulfiller.fulfill(kj::cp(pumpedSoFar));
          } else {
            fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
          }
        }).eagerlyEvaluate([this](kj::Exception&& e) {
          fulfiller.reject(kj::mv(e));
        });
      });

      pipe.endState(*this);
      pipe.abortRead();
    }